

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Own<kj::ConnectionReceiver,_std::nullptr_t> __thiscall
kj::anon_unknown_0::LowLevelAsyncIoProviderImpl::wrapListenSocketFd
          (LowLevelAsyncIoProviderImpl *this,int fd,NetworkFilter *filter,uint flags)

{
  undefined4 in_register_0000000c;
  ConnectionReceiver *extraout_RDX;
  undefined4 in_register_00000034;
  Own<kj::ConnectionReceiver,_std::nullptr_t> OVar1;
  undefined1 local_40 [28];
  uint flags_local;
  NetworkFilter *filter_local;
  EventLoop *pEStack_18;
  int fd_local;
  LowLevelAsyncIoProviderImpl *this_local;
  
  pEStack_18 = (EventLoop *)CONCAT44(in_register_00000034,fd);
  register0x00000008 = (PromiseArena *)CONCAT44(in_register_0000000c,flags);
  filter_local._4_4_ = SUB84(filter,0);
  this_local = this;
  heap<kj::(anonymous_namespace)::FdConnectionReceiver,kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl&,kj::UnixEventPort&,int&,kj::LowLevelAsyncIoProvider::NetworkFilter&,unsigned_int&>
            ((kj *)local_40,(LowLevelAsyncIoProviderImpl *)pEStack_18,
             *(UnixEventPort **)&pEStack_18->running,(int *)((long)&filter_local + 4),
             (NetworkFilter *)register0x00000008,(uint *)(local_40 + 0x14));
  Own<kj::ConnectionReceiver,decltype(nullptr)>::
  Own<kj::(anonymous_namespace)::FdConnectionReceiver,void>
            ((Own<kj::ConnectionReceiver,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::FdConnectionReceiver,_std::nullptr_t> *)local_40);
  Own<kj::(anonymous_namespace)::FdConnectionReceiver,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::FdConnectionReceiver,_std::nullptr_t> *)local_40);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<ConnectionReceiver> wrapListenSocketFd(
      int fd, NetworkFilter& filter, uint flags = 0) override {
    return heap<FdConnectionReceiver>(*this, eventPort, fd, filter, flags);
  }